

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

bool __thiscall cppurses::Event::send_to_all_filters(Event *this)

{
  Widget *pWVar1;
  bool bVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  
  pWVar1 = this->receiver_;
  p_Var4 = (pWVar1->event_filters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((bVar2 = (_Rb_tree_header *)p_Var4 !=
                  &(pWVar1->event_filters_)._M_t._M_impl.super__Rb_tree_header, bVar2 &&
         ((*(char *)(*(long *)(p_Var4 + 1) + 0x328) != '\x01' ||
          (iVar3 = (*this->_vptr_Event[3])(this), (char)iVar3 == '\0'))))) {
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  return bVar2;
}

Assistant:

auto Event::send_to_all_filters() const -> bool
{
    auto const& filters = receiver_.get_event_filters();
    for (Widget* filter : filters) {
        if (filter->enabled() && this->filter_send(*filter))
            return true;
    }
    return false;
}